

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

RGB __thiscall pbrt::MIPMap::Lookup<pbrt::RGB>(MIPMap *this,Point2f *st,Vector2f dst0,Vector2f dst1)

{
  float fVar1;
  undefined8 uVar2;
  size_t sVar3;
  bool bVar4;
  float *__result;
  float *pfVar5;
  long lVar6;
  int level;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar16;
  undefined1 in_register_00001208 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  float fVar21;
  Tuple2<pbrt::Vector2,_float> dst1_00;
  RGB RVar22;
  RGB RVar23;
  RGB RVar24;
  Vector2f local_58;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar19._8_56_ = in_register_00001248;
  auVar19._0_8_ = dst1.super_Tuple2<pbrt::Vector2,_float>;
  auVar13._8_56_ = in_register_00001208;
  auVar13._0_8_ = dst0.super_Tuple2<pbrt::Vector2,_float>;
  auVar9 = auVar13._0_16_;
  auVar17 = auVar19._0_16_;
  if ((this->options).filter != EWA) {
    auVar17 = vmovlhps_avx(auVar9,auVar17);
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    local_48 = vandps_avx512vl(auVar17,auVar9);
    pfVar5 = (float *)local_48;
    lVar6 = 4;
    do {
      if (*pfVar5 < *(float *)(local_48 + lVar6)) {
        pfVar5 = (float *)(local_48 + lVar6);
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    RVar22 = Lookup<pbrt::RGB>(this,st,*pfVar5 + *pfVar5);
    return RVar22;
  }
  auVar10._0_4_ =
       dst0.super_Tuple2<pbrt::Vector2,_float>.x * dst0.super_Tuple2<pbrt::Vector2,_float>.x;
  auVar10._4_4_ =
       dst0.super_Tuple2<pbrt::Vector2,_float>.y * dst0.super_Tuple2<pbrt::Vector2,_float>.y;
  auVar10._8_4_ = in_register_00001208._0_4_ * in_register_00001208._0_4_;
  auVar10._12_4_ = in_register_00001208._4_4_ * in_register_00001208._4_4_;
  auVar10 = vhaddps_avx(auVar10,auVar10);
  auVar20._0_4_ =
       dst1.super_Tuple2<pbrt::Vector2,_float>.x * dst1.super_Tuple2<pbrt::Vector2,_float>.x;
  auVar20._4_4_ =
       dst1.super_Tuple2<pbrt::Vector2,_float>.y * dst1.super_Tuple2<pbrt::Vector2,_float>.y;
  auVar20._8_4_ = in_register_00001248._0_4_ * in_register_00001248._0_4_;
  auVar20._12_4_ = in_register_00001248._4_4_ * in_register_00001248._4_4_;
  auVar20 = vhaddps_avx(auVar20,auVar20);
  auVar18 = auVar9;
  if (auVar20._0_4_ <= auVar10._0_4_) {
    auVar18 = auVar17;
    auVar17 = auVar9;
  }
  dst1_00 = auVar18._0_8_;
  auVar11._0_4_ = auVar17._0_4_ * auVar17._0_4_;
  auVar11._4_4_ = auVar17._4_4_ * auVar17._4_4_;
  auVar11._8_4_ = auVar17._8_4_ * auVar17._8_4_;
  auVar11._12_4_ = auVar17._12_4_ * auVar17._12_4_;
  auVar9 = vhaddps_avx(auVar11,auVar11);
  if (auVar9._0_4_ < 0.0) {
    auVar14._0_4_ = sqrtf(auVar9._0_4_);
    auVar14._4_60_ = extraout_var;
    auVar9 = auVar14._0_16_;
  }
  else {
    auVar9 = vsqrtss_avx(auVar9,auVar9);
  }
  fVar7 = auVar18._0_4_;
  auVar12._0_4_ = fVar7 * fVar7;
  fVar1 = auVar18._4_4_;
  auVar12._4_4_ = fVar1 * fVar1;
  auVar12._8_4_ = auVar18._8_4_ * auVar18._8_4_;
  auVar12._12_4_ = auVar18._12_4_ * auVar18._12_4_;
  auVar10 = vhaddps_avx(auVar12,auVar12);
  if (auVar10._0_4_ < 0.0) {
    auVar15._0_4_ = sqrtf(auVar10._0_4_);
    auVar15._4_60_ = extraout_var_00;
    auVar10 = auVar15._0_16_;
  }
  else {
    auVar10 = vsqrtss_avx(auVar10,auVar10);
  }
  fVar8 = auVar10._0_4_;
  fVar21 = fVar8 * (this->options).maxAnisotropy;
  uVar16 = vcmpps_avx512vl(ZEXT816(0) << 0x40,auVar10,1);
  uVar2 = vcmpps_avx512vl(ZEXT416((uint)fVar21),auVar9,1);
  bVar4 = (bool)((byte)uVar16 & (byte)uVar2 & 1);
  fVar21 = auVar9._0_4_ / fVar21;
  if (bVar4 != false) {
    dst1_00.x = fVar7 * fVar21;
    dst1_00.y = fVar1 * fVar21;
  }
  fVar7 = (float)((uint)bVar4 * (int)(fVar8 * fVar21) + (uint)!bVar4 * (int)fVar8);
  if ((fVar7 == 0.0) && (!NAN(fVar7))) {
    RVar22 = Bilerp<pbrt::RGB>(this,0,(Point2f)st->super_Tuple2<pbrt::Point2,_float>);
    return RVar22;
  }
  sVar3 = (this->pyramid).nStored;
  fVar7 = logf(fVar7);
  auVar10 = vmaxss_avx(ZEXT416((uint)(fVar7 * 1.442695 + (float)((int)sVar3 + -1))),
                       ZEXT816(0) << 0x40);
  auVar9 = vroundss_avx(auVar10,auVar10,9);
  level = (int)auVar9._0_4_;
  auVar18._0_4_ = (int)auVar9._0_4_;
  auVar18._4_4_ = (int)auVar9._4_4_;
  auVar18._8_4_ = (int)auVar9._8_4_;
  auVar18._12_4_ = (int)auVar9._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar18);
  fVar7 = auVar10._0_4_ - auVar9._0_4_;
  local_28 = ZEXT416((uint)fVar7);
  fVar7 = 1.0 - fVar7;
  uVar16 = 0;
  local_58.super_Tuple2<pbrt::Vector2,_float> = auVar17._0_8_;
  RVar22 = EWA<pbrt::RGB>(this,level,(Point2f)st->super_Tuple2<pbrt::Point2,_float>,local_58,
                          (Vector2f)dst1_00);
  local_38 = RVar22._0_8_;
  uStack_30 = uVar16;
  RVar23 = EWA<pbrt::RGB>(this,level + 1,(Point2f)st->super_Tuple2<pbrt::Point2,_float>,local_58,
                          (Vector2f)dst1_00);
  RVar24.r = RVar23.r * (float)local_28._0_4_ + fVar7 * (float)local_38;
  RVar24.g = RVar23.g * (float)local_28._0_4_ + fVar7 * local_38._4_4_;
  RVar24.b = RVar23.b * (float)local_28._0_4_ + RVar22.b * fVar7;
  return RVar24;
}

Assistant:

T MIPMap::Lookup(const Point2f &st, Vector2f dst0, Vector2f dst1) const {
    if (options.filter != FilterFunction::EWA) {
        Float width = std::max(
            {std::abs(dst0[0]), std::abs(dst0[1]), std::abs(dst1[0]), std::abs(dst1[1])});
        return Lookup<T>(st, 2 * width);
    }
    // Compute ellipse minor and major axes
    if (LengthSquared(dst0) < LengthSquared(dst1))
        pstd::swap(dst0, dst1);
    Float majorLength = Length(dst0);
    Float minorLength = Length(dst1);

    // Clamp ellipse eccentricity if too large
    if (minorLength * options.maxAnisotropy < majorLength && minorLength > 0) {
        Float scale = majorLength / (minorLength * options.maxAnisotropy);
        dst1 *= scale;
        minorLength *= scale;
    }
    if (minorLength == 0)
        return Bilerp<T>(0, st);

    // Choose level of detail for EWA lookup and perform EWA filtering
    Float lod = std::max<Float>(0, Levels() - 1 + Log2(minorLength));
    int ilod = std::floor(lod);
    // TODO: just do return EWA<T>(ilog, st, dst0, dst1);
    // TODO: also, when scaling camera ray differentials, just do e.g.
    // 1 / std::min(sqrtSamplesPerPixel, 8);
    return ((1 - (lod - ilod)) * EWA<T>(ilod, st, dst0, dst1) +
            (lod - ilod) * EWA<T>(ilod + 1, st, dst0, dst1));
}